

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

CVmTimeZone * CVmTimeZone::load(ZoneHashEntry *entry)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  FILE *__stream;
  size_t sVar4;
  ushort *__ptr;
  CVmTimeZone *pCVar5;
  ushort local_3a;
  uint local_38;
  uint local_34;
  
  while (iVar3 = *(int *)&(((ZoneHashEntrySynth *)entry)->super_ZoneHashEntry).super_CVmHashEntryCI.
                          super_CVmHashEntry.field_0x24, iVar3 == 2) {
    iVar3 = (*(((ZoneHashEntrySynth *)entry)->super_ZoneHashEntry).super_CVmHashEntryCI.
              super_CVmHashEntry._vptr_CVmHashEntry[3])(entry);
    entry = (ZoneHashEntry *)CONCAT44(extraout_var,iVar3);
  }
  if (iVar3 == 3) {
    pCVar5 = (CVmTimeZone *)operator_new(0x68);
    CVmTimeZone(pCVar5,(ZoneHashEntrySynth *)entry);
  }
  else {
    if ((iVar3 == 1) &&
       (__stream = (FILE *)CVmTimeZoneCache::open_zoneinfo_file(), __stream != (FILE *)0x0)) {
      pCVar5 = (CVmTimeZone *)0x0;
      fseek(__stream,(ulong)(uint)(((ZoneHashEntrySynth *)entry)->synth).std_ofs,0);
      sVar4 = fread(&local_3a,2,1,__stream);
      if (sVar4 == 1) {
        __ptr = (ushort *)operator_new__((ulong)local_3a);
        sVar4 = fread(__ptr,(ulong)local_3a,1,__stream);
        if (sVar4 == 1) {
          local_34 = (uint)__ptr[1];
          uVar2 = *__ptr;
          bVar1 = *(byte *)((long)__ptr + 5);
          local_38 = (uint)(byte)__ptr[2];
          pCVar5 = (CVmTimeZone *)operator_new(0x68);
          CVmTimeZone(pCVar5,(ZoneHashEntryDb *)entry,(char *)(__ptr + 3),(uint)uVar2,local_34,
                      local_38,(uint)bVar1);
        }
        else {
          pCVar5 = (CVmTimeZone *)0x0;
        }
        operator_delete__(__ptr);
      }
      fclose(__stream);
      return pCVar5;
    }
    pCVar5 = (CVmTimeZone *)0x0;
  }
  return pCVar5;
}

Assistant:

CVmTimeZone *CVmTimeZone::load(VMG_ ZoneHashEntry *entry)
{
    /* load according to the data source in the hash table entry */
    if (entry->typ == ZONE_HASH_DB)
    {
        /* it's in the database file - open the file */
        osfildef *fp = CVmTimeZoneCache::open_zoneinfo_file(vmg0_);
        if (fp == 0)
            return 0;

        /* seek to our data */
        osfseek(fp, ((ZoneHashEntryDb *)entry)->seekpos, OSFSK_SET);

        /* read the length prefix */
        char pfx[2];
        int ok = !osfrb(fp, pfx, 2);
        
        /* allocate space for the file data */
        unsigned int alo = osrp2(pfx);
        char *buf = ok ? new char[alo] : 0;
        
        /* read the file data */
        ok = buf != 0 && !osfrb(fp, buf, alo);
        
        /* decode the header */
        unsigned int trans_cnt = osrp2(buf);
        unsigned int type_cnt = osrp2(buf+2);
        unsigned int rule_cnt = osrp1(buf+4);
        unsigned int abbr_bytes = osrp1(buf+5);
        
        /* create the time zone object */
        CVmTimeZone *tz = 0;
        if (ok)
        {
            tz = new CVmTimeZone(
                (ZoneHashEntryDb *)entry,
                buf+6, trans_cnt, type_cnt, rule_cnt, abbr_bytes);
        }

        /* release resources */
        if (buf != 0)
            delete [] buf;
        osfcls(fp);

        /* return the loaded object */
        return tz;
    }
    else if (entry->typ == ZONE_HASH_LINK)
    {
        /* load from the linked object */
        return load(vmg_ entry->resolve_links());
    }
    else if (entry->typ == ZONE_HASH_SYNTH)
    {
        /* create from the zone descriptor */
        return new CVmTimeZone((ZoneHashEntrySynth *)entry);
    }
    else
    {
        /* unknown type */
        return 0;
    }
}